

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompositeATN.cpp
# Opt level: O0

bool __thiscall
Centaurus::CompositeATN<wchar_t>::verify_decisions
          (CompositeATN<wchar_t> *this,
          unordered_map<Centaurus::Identifier,_Centaurus::ATNMachine<wchar_t>,_std::hash<Centaurus::Identifier>,_std::equal_to<Centaurus::Identifier>,_std::allocator<std::pair<const_Centaurus::Identifier,_Centaurus::ATNMachine<wchar_t>_>_>_>
          *network)

{
  int iVar1;
  bool bVar2;
  int iVar3;
  ATNNode<wchar_t> *this_00;
  vector<Centaurus::ATNTransition<wchar_t>,_std::allocator<Centaurus::ATNTransition<wchar_t>_>_>
  *this_01;
  size_type sVar4;
  ATNPath local_a8;
  ATNPath local_88;
  LookaheadDFA<wchar_t> local_68;
  int local_48;
  int local_44;
  int outbound_num;
  int i;
  value_type *p;
  const_iterator __end0;
  const_iterator __begin0;
  unordered_map<Centaurus::Identifier,_Centaurus::ATNMachine<wchar_t>,_std::hash<Centaurus::Identifier>,_std::equal_to<Centaurus::Identifier>,_std::allocator<std::pair<const_Centaurus::Identifier,_Centaurus::ATNMachine<wchar_t>_>_>_>
  *__range2;
  unordered_map<Centaurus::Identifier,_Centaurus::ATNMachine<wchar_t>,_std::hash<Centaurus::Identifier>,_std::equal_to<Centaurus::Identifier>,_std::allocator<std::pair<const_Centaurus::Identifier,_Centaurus::ATNMachine<wchar_t>_>_>_>
  *network_local;
  CompositeATN<wchar_t> *this_local;
  
  __end0 = std::
           unordered_map<Centaurus::Identifier,_Centaurus::ATNMachine<wchar_t>,_std::hash<Centaurus::Identifier>,_std::equal_to<Centaurus::Identifier>,_std::allocator<std::pair<const_Centaurus::Identifier,_Centaurus::ATNMachine<wchar_t>_>_>_>
           ::begin(network);
  p = (value_type *)
      std::
      unordered_map<Centaurus::Identifier,_Centaurus::ATNMachine<wchar_t>,_std::hash<Centaurus::Identifier>,_std::equal_to<Centaurus::Identifier>,_std::allocator<std::pair<const_Centaurus::Identifier,_Centaurus::ATNMachine<wchar_t>_>_>_>
      ::end(network);
  while( true ) {
    bVar2 = std::__detail::operator!=
                      (&__end0.
                        super__Node_iterator_base<std::pair<const_Centaurus::Identifier,_Centaurus::ATNMachine<wchar_t>_>,_true>
                       ,(_Node_iterator_base<std::pair<const_Centaurus::Identifier,_Centaurus::ATNMachine<wchar_t>_>,_true>
                         *)&p);
    if (!bVar2) break;
    _outbound_num =
         std::__detail::
         _Node_const_iterator<std::pair<const_Centaurus::Identifier,_Centaurus::ATNMachine<wchar_t>_>,_false,_true>
         ::operator*(&__end0);
    local_44 = 0;
    while( true ) {
      iVar1 = local_44;
      iVar3 = ATNMachine<wchar_t>::get_node_num(&_outbound_num->second);
      if (iVar3 <= iVar1) break;
      this_00 = ATNMachine<wchar_t>::get_node(&_outbound_num->second,local_44);
      this_01 = ATNNode<wchar_t>::get_transitions(this_00);
      sVar4 = std::
              vector<Centaurus::ATNTransition<wchar_t>,_std::allocator<Centaurus::ATNTransition<wchar_t>_>_>
              ::size(this_01);
      local_48 = (int)sVar4;
      if (1 < local_48) {
        ATNPath::ATNPath(&local_a8,&_outbound_num->first,local_44);
        convert_atn_path(&local_88,this,&local_a8);
        LookaheadDFA<wchar_t>::LookaheadDFA(&local_68,this,&local_88,true);
        LookaheadDFA<wchar_t>::~LookaheadDFA(&local_68);
        ATNPath::~ATNPath(&local_88);
        ATNPath::~ATNPath(&local_a8);
      }
      local_44 = local_44 + 1;
    }
    std::__detail::
    _Node_const_iterator<std::pair<const_Centaurus::Identifier,_Centaurus::ATNMachine<wchar_t>_>,_false,_true>
    ::operator++(&__end0);
  }
  return true;
}

Assistant:

bool CompositeATN<TCHAR>::verify_decisions(const std::unordered_map<Identifier, ATNMachine<TCHAR> >& network) const
{
    for (const auto& p : network)
    {
        for (int i = 0; i < p.second.get_node_num(); i++)
        {
            int outbound_num = p.second.get_node(i).get_transitions().size();

            if (outbound_num > 1)
            {
                try
                {
                    LookaheadDFA<TCHAR>(*this, convert_atn_path(ATNPath(p.first, i)));
                }
                catch (...)
                {
                    std::wcerr << L"Decision check failed at " << ATNPath(p.first, i) << std::endl;
                    return false;
                }
            }
        }
    }
    return true;
}